

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void hadamard_highbd_col8_second_pass(int16_t *src_diff,ptrdiff_t src_stride,int32_t *coeff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int32_t c7;
  int32_t c6;
  int32_t c5;
  int32_t c4;
  int32_t c3;
  int32_t c2;
  int32_t c1;
  int32_t c0;
  int32_t b7;
  int32_t b6;
  int32_t b5;
  int32_t b4;
  int32_t b3;
  int32_t b2;
  int32_t b1;
  int32_t b0;
  int32_t *coeff_local;
  ptrdiff_t src_stride_local;
  int16_t *src_diff_local;
  
  iVar1 = (int)*src_diff + (int)src_diff[src_stride] +
          (int)src_diff[src_stride * 2] + (int)src_diff[src_stride * 3];
  iVar2 = ((int)*src_diff - (int)src_diff[src_stride]) +
          ((int)src_diff[src_stride * 2] - (int)src_diff[src_stride * 3]);
  iVar3 = ((int)*src_diff + (int)src_diff[src_stride]) -
          ((int)src_diff[src_stride * 2] + (int)src_diff[src_stride * 3]);
  iVar4 = ((int)*src_diff - (int)src_diff[src_stride]) -
          ((int)src_diff[src_stride * 2] - (int)src_diff[src_stride * 3]);
  iVar5 = (int)src_diff[src_stride * 4] + (int)src_diff[src_stride * 5] +
          (int)src_diff[src_stride * 6] + (int)src_diff[src_stride * 7];
  iVar6 = ((int)src_diff[src_stride * 4] - (int)src_diff[src_stride * 5]) +
          ((int)src_diff[src_stride * 6] - (int)src_diff[src_stride * 7]);
  iVar7 = ((int)src_diff[src_stride * 4] + (int)src_diff[src_stride * 5]) -
          ((int)src_diff[src_stride * 6] + (int)src_diff[src_stride * 7]);
  iVar8 = ((int)src_diff[src_stride * 4] - (int)src_diff[src_stride * 5]) -
          ((int)src_diff[src_stride * 6] - (int)src_diff[src_stride * 7]);
  *coeff = iVar1 + iVar5;
  coeff[7] = iVar2 + iVar6;
  coeff[3] = iVar3 + iVar7;
  coeff[4] = iVar4 + iVar8;
  coeff[2] = iVar1 - iVar5;
  coeff[6] = iVar2 - iVar6;
  coeff[1] = iVar3 - iVar7;
  coeff[5] = iVar4 - iVar8;
  return;
}

Assistant:

static void hadamard_highbd_col8_second_pass(const int16_t *src_diff,
                                             ptrdiff_t src_stride,
                                             int32_t *coeff) {
  int32_t b0 = src_diff[0 * src_stride] + src_diff[1 * src_stride];
  int32_t b1 = src_diff[0 * src_stride] - src_diff[1 * src_stride];
  int32_t b2 = src_diff[2 * src_stride] + src_diff[3 * src_stride];
  int32_t b3 = src_diff[2 * src_stride] - src_diff[3 * src_stride];
  int32_t b4 = src_diff[4 * src_stride] + src_diff[5 * src_stride];
  int32_t b5 = src_diff[4 * src_stride] - src_diff[5 * src_stride];
  int32_t b6 = src_diff[6 * src_stride] + src_diff[7 * src_stride];
  int32_t b7 = src_diff[6 * src_stride] - src_diff[7 * src_stride];

  int32_t c0 = b0 + b2;
  int32_t c1 = b1 + b3;
  int32_t c2 = b0 - b2;
  int32_t c3 = b1 - b3;
  int32_t c4 = b4 + b6;
  int32_t c5 = b5 + b7;
  int32_t c6 = b4 - b6;
  int32_t c7 = b5 - b7;

  coeff[0] = c0 + c4;
  coeff[7] = c1 + c5;
  coeff[3] = c2 + c6;
  coeff[4] = c3 + c7;
  coeff[2] = c0 - c4;
  coeff[6] = c1 - c5;
  coeff[1] = c2 - c6;
  coeff[5] = c3 - c7;
}